

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesMatchOnCornerCases_Test::
DescriptorTest_FieldNamesMatchOnCornerCases_Test
          (DescriptorTest_FieldNamesMatchOnCornerCases_Test *this)

{
  DescriptorTest_FieldNamesMatchOnCornerCases_Test *this_local;
  
  DescriptorTest::DescriptorTest(&this->super_DescriptorTest);
  (this->super_DescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorTest_FieldNamesMatchOnCornerCases_Test_029a57d8;
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesMatchOnCornerCases) {
  const auto names = [&](auto* field) {
    return std::vector<absl::string_view>{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
  };

  // field_name1
  EXPECT_THAT(
      names(message4_->field(0)),
      ElementsAre("field_name1", "field_name1", "fieldName1", "fieldName1"));
  // fieldName2
  EXPECT_THAT(
      names(message4_->field(1)),
      ElementsAre("fieldName2", "fieldname2", "fieldName2", "fieldName2"));
  // FieldName3
  EXPECT_THAT(
      names(message4_->field(2)),
      ElementsAre("FieldName3", "fieldname3", "fieldName3", "FieldName3"));
  // _field_name4
  EXPECT_THAT(
      names(message4_->field(3)),
      ElementsAre("_field_name4", "_field_name4", "fieldName4", "FieldName4"));
  // FIELD_NAME5
  EXPECT_THAT(
      names(message4_->field(4)),
      ElementsAre("FIELD_NAME5", "field_name5", "fIELDNAME5", "FIELDNAME5"));
  // field_name6, with json name @type
  EXPECT_THAT(names(message4_->field(5)),
              ElementsAre("field_name6", "field_name6", "fieldName6", "@type"));
  // fieldname7
  EXPECT_THAT(
      names(message4_->field(6)),
      ElementsAre("fieldname7", "fieldname7", "fieldname7", "fieldname7"));
}